

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack4to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _val0_1;
  __m256 _w0_1;
  int j_1;
  __m256 _sum0_1;
  int nn_1;
  float *kptr_1;
  float *tmpptr_3;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  __m256 _w0;
  int j;
  __m256 _sum7;
  __m256 _sum6;
  __m256 _sum5;
  __m256 _sum4;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  int nn;
  float *kptr;
  float *tmpptr_2;
  int i_2;
  float *biasptr;
  float zeros [8];
  float *outptr0;
  int p;
  __m128 _val;
  int k_1;
  float *img0_1;
  int q_1;
  float *tmpptr_1;
  int i_1;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r7;
  __m128 _r6;
  __m128 _r5;
  __m128 _r4;
  __m128 _r3;
  __m128 _r2;
  __m128 _r1;
  __m128 _r0;
  int k;
  float *img0;
  int q;
  float *tmpptr;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat tmp;
  float *bias;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_8;
  Mat *m_6;
  Mat *m_3;
  Mat *m_1;
  undefined8 in_stack_ffffffffffffdc38;
  int _elempack;
  undefined4 in_stack_ffffffffffffdc40;
  undefined4 in_stack_ffffffffffffdc44;
  int in_stack_ffffffffffffdc4c;
  int in_stack_ffffffffffffdc50;
  int in_stack_ffffffffffffdc54;
  undefined4 in_stack_ffffffffffffdc58;
  undefined4 in_stack_ffffffffffffdc5c;
  Allocator *in_stack_ffffffffffffdcb8;
  undefined8 *local_21e0;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 local_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 local_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 local_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 local_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  int local_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ec0;
  undefined8 local_1eb8;
  undefined8 local_1eb0;
  undefined4 local_1ea8;
  long local_1ea0;
  undefined4 local_1e98;
  undefined4 local_1e94;
  undefined4 local_1e90;
  undefined4 local_1e8c;
  undefined4 local_1e88;
  undefined8 local_1e80;
  undefined8 *local_1e78;
  undefined8 local_1e70;
  undefined8 local_1e68;
  undefined8 local_1e60;
  undefined4 local_1e58;
  long *local_1e50;
  undefined4 local_1e48;
  undefined4 local_1e44;
  undefined4 local_1e40;
  undefined4 local_1e3c;
  undefined4 local_1e38;
  undefined8 local_1e30;
  float *local_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  int local_1ce4;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  int local_1bc4;
  undefined8 local_1bc0;
  undefined8 local_1bb8;
  undefined8 local_1bb0;
  undefined4 local_1ba8;
  long local_1ba0;
  undefined4 local_1b98;
  undefined4 local_1b94;
  undefined4 local_1b90;
  undefined4 local_1b8c;
  undefined4 local_1b88;
  undefined8 local_1b80;
  undefined8 *local_1b78;
  undefined8 local_1b70;
  undefined8 local_1b68;
  undefined8 local_1b60;
  undefined4 local_1b58;
  long *local_1b50;
  undefined4 local_1b48;
  undefined4 local_1b44;
  undefined4 local_1b40;
  undefined4 local_1b3c;
  undefined4 local_1b38;
  undefined8 local_1b30;
  float *local_1b28;
  int local_1b1c;
  undefined8 *local_1b18;
  undefined8 local_1b10 [5];
  undefined8 local_1ae8;
  undefined8 local_1ae0;
  undefined8 local_1ad8;
  undefined4 local_1ad0;
  long local_1ac8;
  undefined4 local_1ac0;
  undefined4 local_1abc;
  undefined4 local_1ab8;
  undefined4 local_1ab4;
  undefined4 local_1ab0;
  undefined8 local_1aa8;
  undefined8 *local_1aa0;
  int local_1a94;
  undefined8 local_1a90;
  undefined8 uStack_1a88;
  int local_1a74;
  undefined8 local_1a70;
  undefined8 local_1a68;
  undefined8 local_1a60;
  undefined4 local_1a58;
  long local_1a50;
  undefined4 local_1a48;
  undefined4 local_1a44;
  undefined4 local_1a40;
  undefined4 local_1a3c;
  undefined4 local_1a38;
  undefined8 local_1a30;
  undefined8 *local_1a28;
  int local_1a1c;
  undefined8 local_1a18;
  undefined8 local_1a10;
  undefined8 local_1a08;
  undefined4 local_1a00;
  long *local_19f8;
  undefined4 local_19f0;
  undefined4 local_19ec;
  undefined4 local_19e8;
  undefined4 local_19e4;
  undefined4 local_19e0;
  undefined8 local_19d8;
  undefined8 *local_19d0;
  int local_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 local_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 local_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 local_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 local_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 local_18d0;
  undefined8 uStack_18c8;
  int local_18b4;
  undefined8 local_18b0;
  undefined8 local_18a8;
  undefined8 local_18a0;
  undefined4 local_1898;
  long local_1890;
  undefined4 local_1888;
  undefined4 local_1884;
  undefined4 local_1880;
  undefined4 local_187c;
  undefined4 local_1878;
  undefined8 local_1870;
  undefined1 (*local_1868) [16];
  int local_185c;
  undefined8 local_1858;
  undefined8 local_1850;
  undefined8 local_1848;
  undefined4 local_1840;
  long *local_1838;
  undefined4 local_1830;
  undefined4 local_182c;
  undefined4 local_1828;
  undefined4 local_1824;
  undefined4 local_1820;
  undefined8 local_1818;
  undefined8 *local_1810;
  int local_1804;
  int local_1800;
  int local_17fc;
  int local_17f8;
  void *local_17e8;
  int *local_17e0;
  long local_17d8;
  undefined4 local_17d0;
  long *local_17c8;
  undefined4 local_17c0;
  int local_17bc;
  int local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  long local_17a8;
  long local_17a0;
  int local_1798;
  int local_1794;
  int local_1790;
  int local_178c;
  long *local_1778;
  long *local_1770;
  long *local_1768;
  void **local_1760;
  undefined8 *local_1758;
  undefined8 *local_1748;
  undefined8 *local_1738;
  undefined8 *local_1728;
  undefined8 *local_1718;
  undefined8 *local_1708;
  undefined8 *local_16f8;
  undefined8 *local_16e8;
  undefined8 *local_16d8;
  void **local_16c8;
  int local_16a8;
  undefined4 local_16a4;
  void **local_16a0;
  undefined8 *local_1680;
  undefined8 *local_1660;
  undefined8 *local_1640;
  undefined8 *local_1620;
  undefined8 *local_1600;
  undefined8 *local_15e0;
  undefined8 *local_15c0;
  undefined8 *local_15a0;
  undefined8 *local_1580;
  undefined1 local_1575;
  int local_1574;
  void **local_1570;
  undefined8 *local_1568;
  undefined1 local_1545;
  int local_1544;
  void **local_1540;
  undefined8 *local_1538;
  undefined1 local_1515;
  int local_1514;
  undefined8 *local_1508;
  undefined1 local_14e5;
  int local_14e4;
  void **local_14e0;
  undefined8 *local_14d8;
  undefined1 local_14b5;
  int local_14b4;
  void **local_14b0;
  undefined8 *local_14a8;
  undefined8 *local_1488;
  undefined8 *local_1480;
  undefined8 *local_1478;
  undefined8 *local_1470;
  undefined8 *local_1468;
  undefined8 *local_1460;
  undefined8 *local_1458;
  undefined8 *local_1450;
  undefined8 *local_1448;
  undefined1 local_1435;
  int local_1434;
  undefined8 *local_1428;
  undefined1 local_1405;
  int local_1404;
  undefined8 *local_13f8;
  undefined1 local_13d5;
  int local_13d4;
  undefined8 *local_13c8;
  undefined1 local_13a5;
  int local_13a4;
  undefined8 *local_1398;
  void *local_12a0;
  undefined8 *local_1290;
  undefined8 *local_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 *local_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 *local_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 *local_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 *local_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 *local_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 *local_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 *local_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 *local_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 *local_1058;
  undefined8 *local_1050;
  undefined8 *local_1048;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  float local_100c;
  float *local_1008;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  float local_fcc;
  float *local_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  float local_f8c;
  float *local_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  float local_f4c;
  float *local_f48;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  float local_f0c;
  float *local_f08;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  float local_ecc;
  float *local_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  float local_e8c;
  float *local_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  float local_e4c;
  float *local_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  float local_e0c;
  float *local_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined1 (*local_500) [16];
  undefined1 (*local_4f8) [16];
  undefined1 (*local_4f0) [16];
  undefined1 (*local_4e8) [16];
  undefined1 (*local_4e0) [16];
  undefined1 (*local_4d8) [16];
  undefined1 (*local_4d0) [16];
  undefined1 (*local_4c8) [16];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  long local_2b8;
  undefined4 local_2ac;
  long local_2a8;
  long local_2a0;
  undefined4 local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  long local_280;
  undefined4 local_274;
  long local_270;
  long local_268;
  undefined4 local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined8 *local_230;
  undefined4 local_224;
  int local_220;
  int local_21c;
  undefined8 *local_218;
  long local_210;
  undefined4 local_204;
  long local_200;
  undefined8 *local_1f8;
  undefined4 local_1ec;
  int local_1e8;
  int local_1e4;
  undefined8 *local_1e0;
  long *local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined8 *local_1c0;
  undefined4 local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 *local_1a8;
  long *local_1a0;
  undefined4 local_194;
  long local_190;
  undefined8 *local_188;
  undefined4 local_17c;
  int local_178;
  int local_174;
  undefined8 *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  undefined8 *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long *local_130;
  undefined4 local_124;
  long local_120;
  float *local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long *local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_178c = *(int *)((long)in_RDI + 0x2c);
  local_1790 = (int)in_RDI[6];
  local_1794 = (int)in_RDI[7];
  local_1798 = (int)in_RSI[7];
  local_17a0 = *in_RCX;
  local_1760 = &local_17e8;
  local_17e8 = (void *)0x0;
  local_17e0 = (int *)0x0;
  local_17d8 = 0;
  local_17d0 = 0;
  local_17c8 = (long *)0x0;
  local_17c0 = 0;
  local_17bc = 0;
  local_17b8 = 0;
  local_17b4 = 0;
  local_17b0 = 0;
  local_17a8 = 0;
  _elempack = (int)((ulong)in_stack_ffffffffffffdc38 >> 0x20);
  local_1778 = in_RDX;
  local_1770 = in_RSI;
  local_1768 = in_RDI;
  if (local_178c < 8) {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffdc5c,in_stack_ffffffffffffdc58),
                in_stack_ffffffffffffdc54,in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c,
                CONCAT44(in_stack_ffffffffffffdc44,in_stack_ffffffffffffdc40),_elempack,
                in_stack_ffffffffffffdcb8);
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffdc5c,in_stack_ffffffffffffdc58),
                in_stack_ffffffffffffdc54,in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c,
                CONCAT44(in_stack_ffffffffffffdc44,in_stack_ffffffffffffdc40),_elempack,
                in_stack_ffffffffffffdcb8);
  }
  local_17f8 = local_178c >> 3;
  for (local_1800 = 0; local_1800 < local_17f8; local_1800 = local_1800 + 1) {
    local_1804 = local_1800 * 8;
    local_14b4 = local_1804 / 8;
    local_14a8 = &local_1858;
    local_14b0 = &local_17e8;
    local_1c0 = (undefined8 *)((long)local_17e8 + local_17a8 * local_14b4 * local_17d8);
    local_1a8 = &local_1858;
    local_78 = (long)local_17bc * (long)local_17b8 * local_17d8;
    local_1468 = &local_1858;
    local_1758 = &local_1858;
    local_1838 = local_17c8;
    local_7c = 0x10;
    local_1ac = local_17bc;
    local_1b0 = local_17b8;
    local_1b4 = local_17b4;
    local_1c8 = local_17d8;
    local_1cc = local_17d0;
    local_1d8 = local_17c8;
    local_14b5 = 1;
    local_1858 = 0;
    local_1848 = 0;
    local_1840 = 0;
    local_1830 = 0;
    local_182c = 0;
    local_1828 = 0;
    local_1824 = 0;
    local_1820 = 0;
    local_1818 = 0;
    local_1850 = 0;
    local_1810 = local_1c0;
    for (local_185c = 0; local_185c < local_1794; local_185c = local_185c + 1) {
      local_1398 = &local_18b0;
      local_28c = *(int *)((long)local_1768 + 0x2c);
      local_290 = (int)local_1768[6];
      local_294 = *(undefined4 *)((long)local_1768 + 0x34);
      local_2a0 = *local_1768 + local_1768[8] * (long)local_185c * local_1768[2];
      local_2a8 = local_1768[2];
      local_2ac = (undefined4)local_1768[3];
      local_2b8 = local_1768[4];
      local_288 = &local_18b0;
      local_38 = (long)local_28c * (long)local_290 * local_2a8;
      local_1448 = &local_18b0;
      local_1868 = (undefined1 (*) [16])(local_2a0 + (long)(local_1800 << 5) * 4);
      local_1748 = &local_18b0;
      local_3c = 0x10;
      local_13a4 = local_185c;
      local_13a5 = 1;
      local_18b0 = 0;
      local_18a0 = 0;
      local_1898 = 0;
      local_1888 = 0;
      local_1884 = 0;
      local_1880 = 0;
      local_187c = 0;
      local_1878 = 0;
      local_1870 = 0;
      local_18a8 = 0;
      for (local_18b4 = 0; local_18b4 < local_1790; local_18b4 = local_18b4 + 1) {
        local_4c8 = local_1868;
        local_450 = *(undefined8 *)*local_1868;
        uStack_448 = *(undefined8 *)(*local_1868 + 8);
        local_4d0 = local_1868 + 1;
        local_460 = *(undefined8 *)*local_4d0;
        uStack_458 = *(undefined8 *)(local_1868[1] + 8);
        local_4d8 = local_1868 + 2;
        local_470 = *(undefined8 *)*local_4d8;
        uStack_468 = *(undefined8 *)(local_1868[2] + 8);
        local_4e0 = local_1868 + 3;
        local_480 = *(undefined8 *)*local_4e0;
        uStack_478 = *(undefined8 *)(local_1868[3] + 8);
        local_4e8 = local_1868 + 4;
        local_490 = *(undefined8 *)*local_4e8;
        uStack_488 = *(undefined8 *)(local_1868[4] + 8);
        local_4f0 = local_1868 + 5;
        local_4a0 = *(undefined8 *)*local_4f0;
        uStack_498 = *(undefined8 *)(local_1868[5] + 8);
        local_4f8 = local_1868 + 6;
        local_4b0 = *(undefined8 *)*local_4f8;
        uStack_4a8 = *(undefined8 *)(local_1868[6] + 8);
        local_500 = local_1868 + 7;
        local_4c0 = *(undefined8 *)*local_500;
        uStack_4b8 = *(undefined8 *)(local_1868[7] + 8);
        auVar4 = vunpcklps_avx(*local_1868,*local_4d0);
        local_2050 = auVar4._0_8_;
        local_1980 = local_2050;
        uStack_2048 = auVar4._8_8_;
        uStack_1978 = uStack_2048;
        auVar5 = vunpcklps_avx(*local_4d8,*local_4e0);
        local_2060 = auVar5._0_8_;
        local_1960 = local_2060;
        uStack_2058 = auVar5._8_8_;
        uStack_1958 = uStack_2058;
        auVar1 = vunpckhps_avx(*local_1868,*local_4d0);
        local_2070 = auVar1._0_8_;
        local_1970 = local_2070;
        uStack_2068 = auVar1._8_8_;
        uStack_1968 = uStack_2068;
        auVar2 = vunpckhps_avx(*local_4d8,*local_4e0);
        local_2080 = auVar2._0_8_;
        local_1950 = local_2080;
        uStack_2078 = auVar2._8_8_;
        uStack_1948 = uStack_2078;
        local_350 = local_2050;
        uStack_348 = uStack_2048;
        local_360 = local_2060;
        uStack_358 = uStack_2058;
        auVar3 = vunpcklpd_avx(auVar4,auVar5);
        local_2090 = auVar3._0_8_;
        local_18d0 = local_2090;
        uStack_2088 = auVar3._8_8_;
        uStack_18c8 = uStack_2088;
        local_2d0 = local_2060;
        uStack_2c8 = uStack_2058;
        local_2e0 = local_2050;
        uStack_2d8 = uStack_2048;
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        local_20a0 = auVar3._0_8_;
        local_18e0 = local_20a0;
        uStack_2098 = auVar3._8_8_;
        uStack_18d8 = uStack_2098;
        local_370 = local_2070;
        uStack_368 = uStack_2068;
        local_380 = local_2080;
        uStack_378 = uStack_2078;
        auVar3 = vunpcklpd_avx(auVar1,auVar2);
        local_20b0 = auVar3._0_8_;
        local_18f0 = local_20b0;
        uStack_20a8 = auVar3._8_8_;
        uStack_18e8 = uStack_20a8;
        local_2f0 = local_2080;
        uStack_2e8 = uStack_2078;
        local_300 = local_2070;
        uStack_2f8 = uStack_2068;
        auVar3 = vunpckhpd_avx(auVar1,auVar2);
        local_20c0 = auVar3._0_8_;
        local_1900 = local_20c0;
        uStack_20b8 = auVar3._8_8_;
        uStack_18f8 = uStack_20b8;
        auVar4 = vunpcklps_avx(*local_4e8,*local_4f0);
        local_20d0 = auVar4._0_8_;
        local_19c0 = local_20d0;
        uStack_20c8 = auVar4._8_8_;
        uStack_19b8 = uStack_20c8;
        auVar5 = vunpcklps_avx(*local_4f8,*local_500);
        local_20e0 = auVar5._0_8_;
        local_19a0 = local_20e0;
        uStack_20d8 = auVar5._8_8_;
        uStack_1998 = uStack_20d8;
        auVar1 = vunpckhps_avx(*local_4e8,*local_4f0);
        local_20f0 = auVar1._0_8_;
        local_19b0 = local_20f0;
        uStack_20e8 = auVar1._8_8_;
        uStack_19a8 = uStack_20e8;
        auVar2 = vunpckhps_avx(*local_4f8,*local_500);
        local_2100 = auVar2._0_8_;
        local_1990 = local_2100;
        uStack_20f8 = auVar2._8_8_;
        uStack_1988 = uStack_20f8;
        local_390 = local_20d0;
        uStack_388 = uStack_20c8;
        local_3a0 = local_20e0;
        uStack_398 = uStack_20d8;
        auVar3 = vunpcklpd_avx(auVar4,auVar5);
        local_2110 = auVar3._0_8_;
        local_1910 = local_2110;
        uStack_2108 = auVar3._8_8_;
        uStack_1908 = uStack_2108;
        local_310 = local_20e0;
        uStack_308 = uStack_20d8;
        local_320 = local_20d0;
        uStack_318 = uStack_20c8;
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        local_2120 = auVar3._0_8_;
        local_1920 = local_2120;
        uStack_2118 = auVar3._8_8_;
        uStack_1918 = uStack_2118;
        local_3b0 = local_20f0;
        uStack_3a8 = uStack_20e8;
        local_3c0 = local_2100;
        uStack_3b8 = uStack_20f8;
        auVar3 = vunpcklpd_avx(auVar1,auVar2);
        local_2130 = auVar3._0_8_;
        local_1930 = local_2130;
        uStack_2128 = auVar3._8_8_;
        uStack_1928 = uStack_2128;
        local_330 = local_2100;
        uStack_328 = uStack_20f8;
        local_340 = local_20f0;
        uStack_338 = uStack_20e8;
        auVar3 = vunpckhpd_avx(auVar1,auVar2);
        local_2140 = auVar3._0_8_;
        local_1940 = local_2140;
        uStack_2138 = auVar3._8_8_;
        uStack_1938 = uStack_2138;
        local_510 = local_1810;
        local_520 = local_2090;
        uStack_518 = uStack_2088;
        *local_1810 = local_2090;
        local_1810[1] = uStack_2088;
        local_528 = local_1810 + 2;
        local_540 = local_2110;
        uStack_538 = uStack_2108;
        *local_528 = local_2110;
        local_1810[3] = uStack_2108;
        local_548 = local_1810 + 4;
        local_560 = local_20a0;
        uStack_558 = uStack_2098;
        *local_548 = local_20a0;
        local_1810[5] = uStack_2098;
        local_568 = local_1810 + 6;
        local_580 = local_2120;
        uStack_578 = uStack_2118;
        *local_568 = local_2120;
        local_1810[7] = uStack_2118;
        local_588 = local_1810 + 8;
        local_5a0 = local_20b0;
        uStack_598 = uStack_20a8;
        *local_588 = local_20b0;
        local_1810[9] = uStack_20a8;
        local_5a8 = local_1810 + 10;
        local_5c0 = local_2130;
        uStack_5b8 = uStack_2128;
        *local_5a8 = local_2130;
        local_1810[0xb] = uStack_2128;
        local_5c8 = local_1810 + 0xc;
        local_5e0 = local_20c0;
        uStack_5d8 = uStack_20b8;
        *local_5c8 = local_20c0;
        local_1810[0xd] = uStack_20b8;
        local_5e8 = local_1810 + 0xe;
        local_600 = local_2140;
        uStack_5f8 = uStack_2138;
        *local_5e8 = local_2140;
        local_1810[0xf] = uStack_2138;
        local_1868 = (undefined1 (*) [16])(*local_1868 + (long)(local_178c << 2) * 4);
        local_1810 = local_1810 + 0x10;
        local_440 = local_4c0;
        uStack_438 = uStack_4b8;
        local_430 = local_4b0;
        uStack_428 = uStack_4a8;
        local_420 = local_4a0;
        uStack_418 = uStack_498;
        local_410 = local_490;
        uStack_408 = uStack_488;
        local_400 = local_480;
        uStack_3f8 = uStack_478;
        local_3f0 = local_470;
        uStack_3e8 = uStack_468;
        local_3e0 = local_460;
        uStack_3d8 = uStack_458;
        local_3d0 = local_450;
        uStack_3c8 = uStack_448;
      }
      local_15a0 = local_1748;
      local_1890 = local_2b8;
    }
    local_1580 = local_1758;
  }
  local_17fc = local_17f8 * 8;
  for (local_19c4 = local_17fc; local_19c4 < local_178c; local_19c4 = local_19c4 + 1) {
    local_14e4 = local_19c4 / 8 + local_19c4 % 8;
    local_14d8 = &local_1a18;
    local_14e0 = &local_17e8;
    local_188 = (undefined8 *)((long)local_17e8 + local_17a8 * local_14e4 * local_17d8);
    local_170 = &local_1a18;
    local_88 = (long)local_17bc * (long)local_17b8 * local_17d8;
    local_1470 = &local_1a18;
    local_1738 = &local_1a18;
    local_19f8 = local_17c8;
    local_8c = 0x10;
    local_174 = local_17bc;
    local_178 = local_17b8;
    local_17c = local_17b4;
    local_190 = local_17d8;
    local_194 = local_17d0;
    local_1a0 = local_17c8;
    local_14e5 = 1;
    local_1a18 = 0;
    local_1a08 = 0;
    local_1a00 = 0;
    local_19f0 = 0;
    local_19ec = 0;
    local_19e8 = 0;
    local_19e4 = 0;
    local_19e0 = 0;
    local_19d8 = 0;
    local_1a10 = 0;
    local_19d0 = local_188;
    for (local_1a1c = 0; local_1a1c < local_1794; local_1a1c = local_1a1c + 1) {
      local_13c8 = &local_1a70;
      local_254 = *(int *)((long)local_1768 + 0x2c);
      local_258 = (int)local_1768[6];
      local_25c = *(undefined4 *)((long)local_1768 + 0x34);
      local_268 = *local_1768 + local_1768[8] * (long)local_1a1c * local_1768[2];
      local_270 = local_1768[2];
      local_274 = (undefined4)local_1768[3];
      local_280 = local_1768[4];
      local_250 = &local_1a70;
      local_48 = (long)local_254 * (long)local_258 * local_270;
      local_1450 = &local_1a70;
      local_1a28 = (undefined8 *)(local_268 + (long)(local_19c4 << 2) * 4);
      local_1728 = &local_1a70;
      local_4c = 0x10;
      local_13d4 = local_1a1c;
      local_13d5 = 1;
      local_1a70 = 0;
      local_1a60 = 0;
      local_1a58 = 0;
      local_1a48 = 0;
      local_1a44 = 0;
      local_1a40 = 0;
      local_1a3c = 0;
      local_1a38 = 0;
      local_1a30 = 0;
      local_1a68 = 0;
      for (local_1a74 = 0; local_1a74 < local_1790; local_1a74 = local_1a74 + 1) {
        local_508 = local_1a28;
        local_1a90 = *local_1a28;
        uStack_1a88 = local_1a28[1];
        local_608 = local_19d0;
        *local_19d0 = local_1a90;
        local_19d0[1] = uStack_1a88;
        local_1a28 = (undefined8 *)((long)local_1a28 + (long)(local_178c << 2) * 4);
        local_19d0 = local_19d0 + 2;
        local_620 = local_1a90;
        uStack_618 = uStack_1a88;
      }
      local_15e0 = local_1728;
      local_1a50 = local_280;
    }
    local_15c0 = local_1738;
  }
  for (local_1a94 = 0; local_1a94 < local_1798; local_1a94 = local_1a94 + 1) {
    local_1508 = &local_1ae8;
    local_13c = *(int *)((long)local_1770 + 0x2c);
    local_140 = (int)local_1770[6];
    local_144 = *(undefined4 *)((long)local_1770 + 0x34);
    local_1aa0 = (undefined8 *)(*local_1770 + local_1770[8] * (long)local_1a94 * local_1770[2]);
    local_158 = local_1770[2];
    local_15c = (undefined4)local_1770[3];
    local_168 = local_1770[4];
    local_138 = &local_1ae8;
    local_98 = (long)local_13c * (long)local_140 * local_158;
    local_1478 = &local_1ae8;
    local_1718 = &local_1ae8;
    local_9c = 0x10;
    local_1514 = local_1a94;
    local_1515 = 1;
    local_1ae8 = 0;
    local_1ad8 = 0;
    local_1ad0 = 0;
    local_1ac0 = 0;
    local_1abc = 0;
    local_1ab8 = 0;
    local_1ab4 = 0;
    local_1ab0 = 0;
    local_1aa8 = 0;
    local_1ae0 = 0;
    local_1600 = local_1718;
    local_150 = local_1aa0;
    local_1ac8 = local_168;
    memset(local_1b10,0,0x20);
    if (local_17a0 == 0) {
      local_21e0 = local_1b10;
    }
    else {
      local_21e0 = (undefined8 *)(local_17a0 + (long)(local_1a94 << 3) * 4);
    }
    local_1b18 = local_21e0;
    for (local_1b1c = 0; local_1b1c + 7 < local_178c; local_1b1c = local_1b1c + 8) {
      local_1544 = local_1b1c / 8;
      local_1538 = &local_1b70;
      local_1540 = &local_17e8;
      local_118 = (float *)((long)local_17e8 + local_17a8 * local_1544 * local_17d8);
      local_100 = &local_1b70;
      local_a8 = (long)local_17bc * (long)local_17b8 * local_17d8;
      local_1480 = &local_1b70;
      local_1708 = &local_1b70;
      local_1b50 = local_17c8;
      local_ac = 0x10;
      local_104 = local_17bc;
      local_108 = local_17b8;
      local_10c = local_17b4;
      local_120 = local_17d8;
      local_124 = local_17d0;
      local_130 = local_17c8;
      local_1545 = 1;
      local_1b70 = 0;
      local_1b60 = 0;
      local_1b58 = 0;
      local_1b44 = 0;
      local_1b40 = 0;
      local_1b3c = 0;
      local_1b38 = 0;
      local_1b68 = 0;
      local_13f8 = &local_1bc0;
      local_21c = *(int *)((long)local_1778 + 0x2c);
      local_220 = (int)local_1778[6];
      local_224 = *(undefined4 *)((long)local_1778 + 0x34);
      local_230 = (undefined8 *)(*local_1778 + local_1778[8] * (long)local_1a94 * local_1778[2]);
      local_238 = local_1778[2];
      local_23c = (undefined4)local_1778[3];
      local_248 = local_1778[4];
      local_218 = &local_1bc0;
      local_58 = (long)local_21c * (long)local_220 * local_238;
      local_5c = 0x10;
      local_1404 = local_1a94;
      local_1405 = 1;
      local_1b30 = 0;
      local_1b48 = 0;
      local_1458 = &local_1bc0;
      local_16f8 = &local_1bc0;
      local_1bc0 = 0;
      local_1bb0 = 0;
      local_1ba8 = 0;
      local_1b98 = 0;
      local_1b94 = 0;
      local_1b90 = 0;
      local_1b8c = 0;
      local_1b88 = 0;
      local_1b80 = 0;
      local_1bb8 = 0;
      local_1bc4 = local_1794 * local_1790 * 4;
      local_1048 = local_21e0;
      local_1ce0 = *local_21e0;
      uStack_1cd8 = local_21e0[1];
      uStack_1cd0 = local_21e0[2];
      uStack_1cc8 = local_21e0[3];
      local_1cc0 = local_1ce0;
      uStack_1cb8 = uStack_1cd8;
      uStack_1cb0 = uStack_1cd0;
      uStack_1ca8 = uStack_1cc8;
      local_1ca0 = local_1ce0;
      uStack_1c98 = uStack_1cd8;
      uStack_1c90 = uStack_1cd0;
      uStack_1c88 = uStack_1cc8;
      local_1c80 = local_1ce0;
      uStack_1c78 = uStack_1cd8;
      uStack_1c70 = uStack_1cd0;
      uStack_1c68 = uStack_1cc8;
      local_1c60 = local_1ce0;
      uStack_1c58 = uStack_1cd8;
      uStack_1c50 = uStack_1cd0;
      uStack_1c48 = uStack_1cc8;
      local_1c40 = local_1ce0;
      uStack_1c38 = uStack_1cd8;
      uStack_1c30 = uStack_1cd0;
      uStack_1c28 = uStack_1cc8;
      local_1c20 = local_1ce0;
      uStack_1c18 = uStack_1cd8;
      uStack_1c10 = uStack_1cd0;
      uStack_1c08 = uStack_1cc8;
      local_1c00 = local_1ce0;
      uStack_1bf8 = uStack_1cd8;
      uStack_1bf0 = uStack_1cd0;
      uStack_1be8 = uStack_1cc8;
      local_1b78 = local_230;
      local_1b28 = local_118;
      for (local_1ce4 = 0; local_1ce4 < local_1bc4; local_1ce4 = local_1ce4 + 1) {
        local_1288 = local_1b78;
        local_1d20 = *local_1b78;
        uStack_1d18 = local_1b78[1];
        uStack_1d10 = local_1b78[2];
        uStack_1d08 = local_1b78[3];
        local_e08 = local_1b28;
        local_e40 = *local_1b28;
        local_1d40 = CONCAT44(local_e40,local_e40);
        uStack_1d38 = CONCAT44(local_e40,local_e40);
        uStack_1d30 = CONCAT44(local_e40,local_e40);
        uStack_1d28 = CONCAT44(local_e40,local_e40);
        local_e48 = local_1b28 + 1;
        local_e80 = *local_e48;
        local_1d60 = CONCAT44(local_e80,local_e80);
        uStack_1d58 = CONCAT44(local_e80,local_e80);
        uStack_1d50 = CONCAT44(local_e80,local_e80);
        uStack_1d48 = CONCAT44(local_e80,local_e80);
        local_b00 = local_1c00;
        uStack_af8 = uStack_1bf8;
        uStack_af0 = uStack_1bf0;
        uStack_ae8 = uStack_1be8;
        local_860._0_4_ = (float)local_1d20;
        local_860._4_4_ = (float)((ulong)local_1d20 >> 0x20);
        uStack_858._0_4_ = (float)uStack_1d18;
        uStack_858._4_4_ = (float)((ulong)uStack_1d18 >> 0x20);
        uStack_850._0_4_ = (float)uStack_1d10;
        uStack_850._4_4_ = (float)((ulong)uStack_1d10 >> 0x20);
        uStack_848._0_4_ = (float)uStack_1d08;
        local_a80 = local_e40 * (float)local_860;
        fStack_a7c = local_e40 * local_860._4_4_;
        fStack_a78 = local_e40 * (float)uStack_858;
        fStack_a74 = local_e40 * uStack_858._4_4_;
        fStack_a70 = local_e40 * (float)uStack_850;
        fStack_a6c = local_e40 * uStack_850._4_4_;
        fStack_a68 = local_e40 * (float)uStack_848;
        uVar6 = local_1c00;
        uVar7 = uStack_1bf8;
        uVar8 = uStack_1bf0;
        uVar9 = uStack_1be8;
        local_aa0._0_4_ = (float)local_1c00;
        local_aa0._4_4_ = (float)((ulong)local_1c00 >> 0x20);
        uStack_a98._0_4_ = (float)uStack_1bf8;
        uStack_a98._4_4_ = (float)((ulong)uStack_1bf8 >> 0x20);
        uStack_a90._0_4_ = (float)uStack_1bf0;
        uStack_a90._4_4_ = (float)((ulong)uStack_1bf0 >> 0x20);
        uStack_a88._0_4_ = (float)uStack_1be8;
        uStack_a88._4_4_ = (float)((ulong)uStack_1be8 >> 0x20);
        local_1c00 = CONCAT44(fStack_a7c + local_aa0._4_4_,local_a80 + (float)local_aa0);
        uStack_1bf8 = CONCAT44(fStack_a74 + uStack_a98._4_4_,fStack_a78 + (float)uStack_a98);
        uStack_1bf0 = CONCAT44(fStack_a6c + uStack_a90._4_4_,fStack_a70 + (float)uStack_a90);
        uStack_1be8 = CONCAT44(local_e40 + uStack_a88._4_4_,fStack_a68 + (float)uStack_a88);
        local_b60 = local_1c20;
        uStack_b58 = uStack_1c18;
        uStack_b50 = uStack_1c10;
        uStack_b48 = uStack_1c08;
        local_a40 = local_e80 * (float)local_860;
        fStack_a3c = local_e80 * local_860._4_4_;
        fStack_a38 = local_e80 * (float)uStack_858;
        fStack_a34 = local_e80 * uStack_858._4_4_;
        fStack_a30 = local_e80 * (float)uStack_850;
        fStack_a2c = local_e80 * uStack_850._4_4_;
        fStack_a28 = local_e80 * (float)uStack_848;
        uVar10 = local_1c20;
        uVar11 = uStack_1c18;
        uVar12 = uStack_1c10;
        uVar13 = uStack_1c08;
        local_a60._0_4_ = (float)local_1c20;
        local_a60._4_4_ = (float)((ulong)local_1c20 >> 0x20);
        uStack_a58._0_4_ = (float)uStack_1c18;
        uStack_a58._4_4_ = (float)((ulong)uStack_1c18 >> 0x20);
        uStack_a50._0_4_ = (float)uStack_1c10;
        uStack_a50._4_4_ = (float)((ulong)uStack_1c10 >> 0x20);
        uStack_a48._0_4_ = (float)uStack_1c08;
        uStack_a48._4_4_ = (float)((ulong)uStack_1c08 >> 0x20);
        local_1c20 = CONCAT44(fStack_a3c + local_a60._4_4_,local_a40 + (float)local_a60);
        uStack_1c18 = CONCAT44(fStack_a34 + uStack_a58._4_4_,fStack_a38 + (float)uStack_a58);
        uStack_1c10 = CONCAT44(fStack_a2c + uStack_a50._4_4_,fStack_a30 + (float)uStack_a50);
        uStack_1c08 = CONCAT44(local_e80 + uStack_a48._4_4_,fStack_a28 + (float)uStack_a48);
        local_e88 = local_1b28 + 2;
        local_ec0 = *local_e88;
        local_1d80 = CONCAT44(local_ec0,local_ec0);
        uStack_1d78 = CONCAT44(local_ec0,local_ec0);
        uStack_1d70 = CONCAT44(local_ec0,local_ec0);
        uStack_1d68 = CONCAT44(local_ec0,local_ec0);
        local_ec8 = local_1b28 + 3;
        local_f00 = *local_ec8;
        local_1da0 = CONCAT44(local_f00,local_f00);
        uStack_1d98 = CONCAT44(local_f00,local_f00);
        uStack_1d90 = CONCAT44(local_f00,local_f00);
        uStack_1d88 = CONCAT44(local_f00,local_f00);
        local_bc0 = local_1c40;
        uStack_bb8 = uStack_1c38;
        uStack_bb0 = uStack_1c30;
        uStack_ba8 = uStack_1c28;
        local_a00 = local_ec0 * (float)local_860;
        fStack_9fc = local_ec0 * local_860._4_4_;
        fStack_9f8 = local_ec0 * (float)uStack_858;
        fStack_9f4 = local_ec0 * uStack_858._4_4_;
        fStack_9f0 = local_ec0 * (float)uStack_850;
        fStack_9ec = local_ec0 * uStack_850._4_4_;
        fStack_9e8 = local_ec0 * (float)uStack_848;
        uVar14 = local_1c40;
        uVar15 = uStack_1c38;
        uVar16 = uStack_1c30;
        uVar17 = uStack_1c28;
        local_a20._0_4_ = (float)local_1c40;
        local_a20._4_4_ = (float)((ulong)local_1c40 >> 0x20);
        uStack_a18._0_4_ = (float)uStack_1c38;
        uStack_a18._4_4_ = (float)((ulong)uStack_1c38 >> 0x20);
        uStack_a10._0_4_ = (float)uStack_1c30;
        uStack_a10._4_4_ = (float)((ulong)uStack_1c30 >> 0x20);
        uStack_a08._0_4_ = (float)uStack_1c28;
        uStack_a08._4_4_ = (float)((ulong)uStack_1c28 >> 0x20);
        local_1c40 = CONCAT44(fStack_9fc + local_a20._4_4_,local_a00 + (float)local_a20);
        uStack_1c38 = CONCAT44(fStack_9f4 + uStack_a18._4_4_,fStack_9f8 + (float)uStack_a18);
        uStack_1c30 = CONCAT44(fStack_9ec + uStack_a10._4_4_,fStack_9f0 + (float)uStack_a10);
        uStack_1c28 = CONCAT44(local_ec0 + uStack_a08._4_4_,fStack_9e8 + (float)uStack_a08);
        local_c20 = local_1c60;
        uStack_c18 = uStack_1c58;
        uStack_c10 = uStack_1c50;
        uStack_c08 = uStack_1c48;
        local_9c0 = local_f00 * (float)local_860;
        fStack_9bc = local_f00 * local_860._4_4_;
        fStack_9b8 = local_f00 * (float)uStack_858;
        fStack_9b4 = local_f00 * uStack_858._4_4_;
        fStack_9b0 = local_f00 * (float)uStack_850;
        fStack_9ac = local_f00 * uStack_850._4_4_;
        fStack_9a8 = local_f00 * (float)uStack_848;
        uVar18 = local_1c60;
        uVar19 = uStack_1c58;
        uVar20 = uStack_1c50;
        uVar21 = uStack_1c48;
        local_9e0._0_4_ = (float)local_1c60;
        local_9e0._4_4_ = (float)((ulong)local_1c60 >> 0x20);
        uStack_9d8._0_4_ = (float)uStack_1c58;
        uStack_9d8._4_4_ = (float)((ulong)uStack_1c58 >> 0x20);
        uStack_9d0._0_4_ = (float)uStack_1c50;
        uStack_9d0._4_4_ = (float)((ulong)uStack_1c50 >> 0x20);
        uStack_9c8._0_4_ = (float)uStack_1c48;
        uStack_9c8._4_4_ = (float)((ulong)uStack_1c48 >> 0x20);
        local_1c60 = CONCAT44(fStack_9bc + local_9e0._4_4_,local_9c0 + (float)local_9e0);
        uStack_1c58 = CONCAT44(fStack_9b4 + uStack_9d8._4_4_,fStack_9b8 + (float)uStack_9d8);
        uStack_1c50 = CONCAT44(fStack_9ac + uStack_9d0._4_4_,fStack_9b0 + (float)uStack_9d0);
        uStack_1c48 = CONCAT44(local_f00 + uStack_9c8._4_4_,fStack_9a8 + (float)uStack_9c8);
        local_f08 = local_1b28 + 4;
        local_f40 = *local_f08;
        local_1dc0 = CONCAT44(local_f40,local_f40);
        uStack_1db8 = CONCAT44(local_f40,local_f40);
        uStack_1db0 = CONCAT44(local_f40,local_f40);
        uStack_1da8 = CONCAT44(local_f40,local_f40);
        local_f48 = local_1b28 + 5;
        local_f80 = *local_f48;
        local_1de0 = CONCAT44(local_f80,local_f80);
        uStack_1dd8 = CONCAT44(local_f80,local_f80);
        uStack_1dd0 = CONCAT44(local_f80,local_f80);
        uStack_1dc8 = CONCAT44(local_f80,local_f80);
        local_c80 = local_1c80;
        uStack_c78 = uStack_1c78;
        uStack_c70 = uStack_1c70;
        uStack_c68 = uStack_1c68;
        local_980 = local_f40 * (float)local_860;
        fStack_97c = local_f40 * local_860._4_4_;
        fStack_978 = local_f40 * (float)uStack_858;
        fStack_974 = local_f40 * uStack_858._4_4_;
        fStack_970 = local_f40 * (float)uStack_850;
        fStack_96c = local_f40 * uStack_850._4_4_;
        fStack_968 = local_f40 * (float)uStack_848;
        uVar22 = local_1c80;
        uVar23 = uStack_1c78;
        uVar24 = uStack_1c70;
        uVar25 = uStack_1c68;
        local_9a0._0_4_ = (float)local_1c80;
        local_9a0._4_4_ = (float)((ulong)local_1c80 >> 0x20);
        uStack_998._0_4_ = (float)uStack_1c78;
        uStack_998._4_4_ = (float)((ulong)uStack_1c78 >> 0x20);
        uStack_990._0_4_ = (float)uStack_1c70;
        uStack_990._4_4_ = (float)((ulong)uStack_1c70 >> 0x20);
        uStack_988._0_4_ = (float)uStack_1c68;
        uStack_988._4_4_ = (float)((ulong)uStack_1c68 >> 0x20);
        local_1c80 = CONCAT44(fStack_97c + local_9a0._4_4_,local_980 + (float)local_9a0);
        uStack_1c78 = CONCAT44(fStack_974 + uStack_998._4_4_,fStack_978 + (float)uStack_998);
        uStack_1c70 = CONCAT44(fStack_96c + uStack_990._4_4_,fStack_970 + (float)uStack_990);
        uStack_1c68 = CONCAT44(local_f40 + uStack_988._4_4_,fStack_968 + (float)uStack_988);
        local_ce0 = local_1ca0;
        uStack_cd8 = uStack_1c98;
        uStack_cd0 = uStack_1c90;
        uStack_cc8 = uStack_1c88;
        local_940 = local_f80 * (float)local_860;
        fStack_93c = local_f80 * local_860._4_4_;
        fStack_938 = local_f80 * (float)uStack_858;
        fStack_934 = local_f80 * uStack_858._4_4_;
        fStack_930 = local_f80 * (float)uStack_850;
        fStack_92c = local_f80 * uStack_850._4_4_;
        fStack_928 = local_f80 * (float)uStack_848;
        uVar26 = local_1ca0;
        uVar27 = uStack_1c98;
        uVar28 = uStack_1c90;
        uVar29 = uStack_1c88;
        local_960._0_4_ = (float)local_1ca0;
        local_960._4_4_ = (float)((ulong)local_1ca0 >> 0x20);
        uStack_958._0_4_ = (float)uStack_1c98;
        uStack_958._4_4_ = (float)((ulong)uStack_1c98 >> 0x20);
        uStack_950._0_4_ = (float)uStack_1c90;
        uStack_950._4_4_ = (float)((ulong)uStack_1c90 >> 0x20);
        uStack_948._0_4_ = (float)uStack_1c88;
        uStack_948._4_4_ = (float)((ulong)uStack_1c88 >> 0x20);
        local_1ca0 = CONCAT44(fStack_93c + local_960._4_4_,local_940 + (float)local_960);
        uStack_1c98 = CONCAT44(fStack_934 + uStack_958._4_4_,fStack_938 + (float)uStack_958);
        uStack_1c90 = CONCAT44(fStack_92c + uStack_950._4_4_,fStack_930 + (float)uStack_950);
        uStack_1c88 = CONCAT44(local_f80 + uStack_948._4_4_,fStack_928 + (float)uStack_948);
        local_f88 = local_1b28 + 6;
        local_fc0 = *local_f88;
        local_1e00 = CONCAT44(local_fc0,local_fc0);
        uStack_1df8 = CONCAT44(local_fc0,local_fc0);
        uStack_1df0 = CONCAT44(local_fc0,local_fc0);
        uStack_1de8 = CONCAT44(local_fc0,local_fc0);
        local_fc8 = local_1b28 + 7;
        local_1000 = *local_fc8;
        local_1e20 = CONCAT44(local_1000,local_1000);
        uStack_1e18 = CONCAT44(local_1000,local_1000);
        uStack_1e10 = CONCAT44(local_1000,local_1000);
        uStack_1e08 = CONCAT44(local_1000,local_1000);
        local_d40 = local_1cc0;
        uStack_d38 = uStack_1cb8;
        uStack_d30 = uStack_1cb0;
        uStack_d28 = uStack_1ca8;
        local_900 = local_fc0 * (float)local_860;
        fStack_8fc = local_fc0 * local_860._4_4_;
        fStack_8f8 = local_fc0 * (float)uStack_858;
        fStack_8f4 = local_fc0 * uStack_858._4_4_;
        fStack_8f0 = local_fc0 * (float)uStack_850;
        fStack_8ec = local_fc0 * uStack_850._4_4_;
        fStack_8e8 = local_fc0 * (float)uStack_848;
        uVar30 = local_1cc0;
        uVar31 = uStack_1cb8;
        uVar32 = uStack_1cb0;
        uVar33 = uStack_1ca8;
        local_920._0_4_ = (float)local_1cc0;
        local_920._4_4_ = (float)((ulong)local_1cc0 >> 0x20);
        uStack_918._0_4_ = (float)uStack_1cb8;
        uStack_918._4_4_ = (float)((ulong)uStack_1cb8 >> 0x20);
        uStack_910._0_4_ = (float)uStack_1cb0;
        uStack_910._4_4_ = (float)((ulong)uStack_1cb0 >> 0x20);
        uStack_908._0_4_ = (float)uStack_1ca8;
        uStack_908._4_4_ = (float)((ulong)uStack_1ca8 >> 0x20);
        local_1cc0 = CONCAT44(fStack_8fc + local_920._4_4_,local_900 + (float)local_920);
        uStack_1cb8 = CONCAT44(fStack_8f4 + uStack_918._4_4_,fStack_8f8 + (float)uStack_918);
        uStack_1cb0 = CONCAT44(fStack_8ec + uStack_910._4_4_,fStack_8f0 + (float)uStack_910);
        uStack_1ca8 = CONCAT44(local_fc0 + uStack_908._4_4_,fStack_8e8 + (float)uStack_908);
        local_da0 = local_1ce0;
        uStack_d98 = uStack_1cd8;
        uStack_d90 = uStack_1cd0;
        uStack_d88 = uStack_1cc8;
        local_8c0 = local_1000 * (float)local_860;
        fStack_8bc = local_1000 * local_860._4_4_;
        fStack_8b8 = local_1000 * (float)uStack_858;
        fStack_8b4 = local_1000 * uStack_858._4_4_;
        fStack_8b0 = local_1000 * (float)uStack_850;
        fStack_8ac = local_1000 * uStack_850._4_4_;
        fStack_8a8 = local_1000 * (float)uStack_848;
        uVar34 = local_1ce0;
        uVar35 = uStack_1cd8;
        uVar36 = uStack_1cd0;
        uVar37 = uStack_1cc8;
        local_8e0._0_4_ = (float)local_1ce0;
        local_8e0._4_4_ = (float)((ulong)local_1ce0 >> 0x20);
        uStack_8d8._0_4_ = (float)uStack_1cd8;
        uStack_8d8._4_4_ = (float)((ulong)uStack_1cd8 >> 0x20);
        uStack_8d0._0_4_ = (float)uStack_1cd0;
        uStack_8d0._4_4_ = (float)((ulong)uStack_1cd0 >> 0x20);
        uStack_8c8._0_4_ = (float)uStack_1cc8;
        uStack_8c8._4_4_ = (float)((ulong)uStack_1cc8 >> 0x20);
        local_1ce0 = CONCAT44(fStack_8bc + local_8e0._4_4_,local_8c0 + (float)local_8e0);
        uStack_1cd8 = CONCAT44(fStack_8b4 + uStack_8d8._4_4_,fStack_8b8 + (float)uStack_8d8);
        uStack_1cd0 = CONCAT44(fStack_8ac + uStack_8d0._4_4_,fStack_8b0 + (float)uStack_8d0);
        uStack_1cc8 = CONCAT44(local_1000 + uStack_8c8._4_4_,fStack_8a8 + (float)uStack_8c8);
        local_1b78 = local_1b78 + 4;
        local_1b28 = local_1b28 + 8;
        fStack_ffc = local_1000;
        fStack_ff8 = local_1000;
        fStack_ff4 = local_1000;
        fStack_ff0 = local_1000;
        fStack_fec = local_1000;
        fStack_fe8 = local_1000;
        fStack_fe4 = local_1000;
        local_fcc = local_1000;
        fStack_fbc = local_fc0;
        fStack_fb8 = local_fc0;
        fStack_fb4 = local_fc0;
        fStack_fb0 = local_fc0;
        fStack_fac = local_fc0;
        fStack_fa8 = local_fc0;
        fStack_fa4 = local_fc0;
        local_f8c = local_fc0;
        fStack_f7c = local_f80;
        fStack_f78 = local_f80;
        fStack_f74 = local_f80;
        fStack_f70 = local_f80;
        fStack_f6c = local_f80;
        fStack_f68 = local_f80;
        fStack_f64 = local_f80;
        local_f4c = local_f80;
        fStack_f3c = local_f40;
        fStack_f38 = local_f40;
        fStack_f34 = local_f40;
        fStack_f30 = local_f40;
        fStack_f2c = local_f40;
        fStack_f28 = local_f40;
        fStack_f24 = local_f40;
        local_f0c = local_f40;
        fStack_efc = local_f00;
        fStack_ef8 = local_f00;
        fStack_ef4 = local_f00;
        fStack_ef0 = local_f00;
        fStack_eec = local_f00;
        fStack_ee8 = local_f00;
        fStack_ee4 = local_f00;
        local_ecc = local_f00;
        fStack_ebc = local_ec0;
        fStack_eb8 = local_ec0;
        fStack_eb4 = local_ec0;
        fStack_eb0 = local_ec0;
        fStack_eac = local_ec0;
        fStack_ea8 = local_ec0;
        fStack_ea4 = local_ec0;
        local_e8c = local_ec0;
        fStack_e7c = local_e80;
        fStack_e78 = local_e80;
        fStack_e74 = local_e80;
        fStack_e70 = local_e80;
        fStack_e6c = local_e80;
        fStack_e68 = local_e80;
        fStack_e64 = local_e80;
        local_e4c = local_e80;
        fStack_e3c = local_e40;
        fStack_e38 = local_e40;
        fStack_e34 = local_e40;
        fStack_e30 = local_e40;
        fStack_e2c = local_e40;
        fStack_e28 = local_e40;
        fStack_e24 = local_e40;
        local_e0c = local_e40;
        local_d80 = local_1d20;
        uStack_d78 = uStack_1d18;
        uStack_d70 = uStack_1d10;
        uStack_d68 = uStack_1d08;
        local_d60 = local_1e20;
        uStack_d58 = uStack_1e18;
        uStack_d50 = uStack_1e10;
        uStack_d48 = uStack_1e08;
        local_d20 = local_1d20;
        uStack_d18 = uStack_1d18;
        uStack_d10 = uStack_1d10;
        uStack_d08 = uStack_1d08;
        local_d00 = local_1e00;
        uStack_cf8 = uStack_1df8;
        uStack_cf0 = uStack_1df0;
        uStack_ce8 = uStack_1de8;
        local_cc0 = local_1d20;
        uStack_cb8 = uStack_1d18;
        uStack_cb0 = uStack_1d10;
        uStack_ca8 = uStack_1d08;
        local_ca0 = local_1de0;
        uStack_c98 = uStack_1dd8;
        uStack_c90 = uStack_1dd0;
        uStack_c88 = uStack_1dc8;
        local_c60 = local_1d20;
        uStack_c58 = uStack_1d18;
        uStack_c50 = uStack_1d10;
        uStack_c48 = uStack_1d08;
        local_c40 = local_1dc0;
        uStack_c38 = uStack_1db8;
        uStack_c30 = uStack_1db0;
        uStack_c28 = uStack_1da8;
        local_c00 = local_1d20;
        uStack_bf8 = uStack_1d18;
        uStack_bf0 = uStack_1d10;
        uStack_be8 = uStack_1d08;
        local_be0 = local_1da0;
        uStack_bd8 = uStack_1d98;
        uStack_bd0 = uStack_1d90;
        uStack_bc8 = uStack_1d88;
        local_ba0 = local_1d20;
        uStack_b98 = uStack_1d18;
        uStack_b90 = uStack_1d10;
        uStack_b88 = uStack_1d08;
        local_b80 = local_1d80;
        uStack_b78 = uStack_1d78;
        uStack_b70 = uStack_1d70;
        uStack_b68 = uStack_1d68;
        local_b40 = local_1d20;
        uStack_b38 = uStack_1d18;
        uStack_b30 = uStack_1d10;
        uStack_b28 = uStack_1d08;
        local_b20 = local_1d60;
        uStack_b18 = uStack_1d58;
        uStack_b10 = uStack_1d50;
        uStack_b08 = uStack_1d48;
        local_ae0 = local_1d20;
        uStack_ad8 = uStack_1d18;
        uStack_ad0 = uStack_1d10;
        uStack_ac8 = uStack_1d08;
        local_ac0 = local_1d40;
        uStack_ab8 = uStack_1d38;
        uStack_ab0 = uStack_1d30;
        uStack_aa8 = uStack_1d28;
        local_aa0 = uVar6;
        uStack_a98 = uVar7;
        uStack_a90 = uVar8;
        uStack_a88 = uVar9;
        fStack_a64 = local_e40;
        local_a60 = uVar10;
        uStack_a58 = uVar11;
        uStack_a50 = uVar12;
        uStack_a48 = uVar13;
        fStack_a24 = local_e80;
        local_a20 = uVar14;
        uStack_a18 = uVar15;
        uStack_a10 = uVar16;
        uStack_a08 = uVar17;
        fStack_9e4 = local_ec0;
        local_9e0 = uVar18;
        uStack_9d8 = uVar19;
        uStack_9d0 = uVar20;
        uStack_9c8 = uVar21;
        fStack_9a4 = local_f00;
        local_9a0 = uVar22;
        uStack_998 = uVar23;
        uStack_990 = uVar24;
        uStack_988 = uVar25;
        fStack_964 = local_f40;
        local_960 = uVar26;
        uStack_958 = uVar27;
        uStack_950 = uVar28;
        uStack_948 = uVar29;
        fStack_924 = local_f80;
        local_920 = uVar30;
        uStack_918 = uVar31;
        uStack_910 = uVar32;
        uStack_908 = uVar33;
        fStack_8e4 = local_fc0;
        local_8e0 = uVar34;
        uStack_8d8 = uVar35;
        uStack_8d0 = uVar36;
        uStack_8c8 = uVar37;
        fStack_8a4 = local_1000;
        local_860 = local_1d20;
        uStack_858 = uStack_1d18;
        uStack_850 = uStack_1d10;
        uStack_848 = uStack_1d08;
        local_840 = local_e40;
        fStack_83c = local_e40;
        fStack_838 = local_e40;
        fStack_834 = local_e40;
        fStack_830 = local_e40;
        fStack_82c = local_e40;
        fStack_828 = local_e40;
        fStack_824 = local_e40;
        local_820 = local_1d20;
        uStack_818 = uStack_1d18;
        uStack_810 = uStack_1d10;
        uStack_808 = uStack_1d08;
        local_800 = local_e80;
        fStack_7fc = local_e80;
        fStack_7f8 = local_e80;
        fStack_7f4 = local_e80;
        fStack_7f0 = local_e80;
        fStack_7ec = local_e80;
        fStack_7e8 = local_e80;
        fStack_7e4 = local_e80;
        local_7e0 = local_1d20;
        uStack_7d8 = uStack_1d18;
        uStack_7d0 = uStack_1d10;
        uStack_7c8 = uStack_1d08;
        local_7c0 = local_ec0;
        fStack_7bc = local_ec0;
        fStack_7b8 = local_ec0;
        fStack_7b4 = local_ec0;
        fStack_7b0 = local_ec0;
        fStack_7ac = local_ec0;
        fStack_7a8 = local_ec0;
        fStack_7a4 = local_ec0;
        local_7a0 = local_1d20;
        uStack_798 = uStack_1d18;
        uStack_790 = uStack_1d10;
        uStack_788 = uStack_1d08;
        local_780 = local_f00;
        fStack_77c = local_f00;
        fStack_778 = local_f00;
        fStack_774 = local_f00;
        fStack_770 = local_f00;
        fStack_76c = local_f00;
        fStack_768 = local_f00;
        fStack_764 = local_f00;
        local_760 = local_1d20;
        uStack_758 = uStack_1d18;
        uStack_750 = uStack_1d10;
        uStack_748 = uStack_1d08;
        local_740 = local_f40;
        fStack_73c = local_f40;
        fStack_738 = local_f40;
        fStack_734 = local_f40;
        fStack_730 = local_f40;
        fStack_72c = local_f40;
        fStack_728 = local_f40;
        fStack_724 = local_f40;
        local_720 = local_1d20;
        uStack_718 = uStack_1d18;
        uStack_710 = uStack_1d10;
        uStack_708 = uStack_1d08;
        local_700 = local_f80;
        fStack_6fc = local_f80;
        fStack_6f8 = local_f80;
        fStack_6f4 = local_f80;
        fStack_6f0 = local_f80;
        fStack_6ec = local_f80;
        fStack_6e8 = local_f80;
        fStack_6e4 = local_f80;
        local_6e0 = local_1d20;
        uStack_6d8 = uStack_1d18;
        uStack_6d0 = uStack_1d10;
        uStack_6c8 = uStack_1d08;
        local_6c0 = local_fc0;
        fStack_6bc = local_fc0;
        fStack_6b8 = local_fc0;
        fStack_6b4 = local_fc0;
        fStack_6b0 = local_fc0;
        fStack_6ac = local_fc0;
        fStack_6a8 = local_fc0;
        fStack_6a4 = local_fc0;
        local_6a0 = local_1d20;
        uStack_698 = uStack_1d18;
        uStack_690 = uStack_1d10;
        uStack_688 = uStack_1d08;
        local_680 = local_1000;
        fStack_67c = local_1000;
        fStack_678 = local_1000;
        fStack_674 = local_1000;
        fStack_670 = local_1000;
        fStack_66c = local_1000;
        fStack_668 = local_1000;
        fStack_664 = local_1000;
      }
      local_1058 = local_1aa0;
      local_1080 = local_1c00;
      uStack_1078 = uStack_1bf8;
      uStack_1070 = uStack_1bf0;
      uStack_1068 = uStack_1be8;
      *local_1aa0 = local_1c00;
      local_1aa0[1] = uStack_1bf8;
      local_1aa0[2] = uStack_1bf0;
      local_1aa0[3] = uStack_1be8;
      local_1088 = local_1aa0 + 4;
      local_10c0 = local_1c20;
      uStack_10b8 = uStack_1c18;
      uStack_10b0 = uStack_1c10;
      uStack_10a8 = uStack_1c08;
      *local_1088 = local_1c20;
      local_1aa0[5] = uStack_1c18;
      local_1aa0[6] = uStack_1c10;
      local_1aa0[7] = uStack_1c08;
      local_10c8 = local_1aa0 + 8;
      local_1100 = local_1c40;
      uStack_10f8 = uStack_1c38;
      uStack_10f0 = uStack_1c30;
      uStack_10e8 = uStack_1c28;
      *local_10c8 = local_1c40;
      local_1aa0[9] = uStack_1c38;
      local_1aa0[10] = uStack_1c30;
      local_1aa0[0xb] = uStack_1c28;
      local_1108 = local_1aa0 + 0xc;
      local_1140 = local_1c60;
      uStack_1138 = uStack_1c58;
      uStack_1130 = uStack_1c50;
      uStack_1128 = uStack_1c48;
      *local_1108 = local_1c60;
      local_1aa0[0xd] = uStack_1c58;
      local_1aa0[0xe] = uStack_1c50;
      local_1aa0[0xf] = uStack_1c48;
      local_1148 = local_1aa0 + 0x10;
      local_1180 = local_1c80;
      uStack_1178 = uStack_1c78;
      uStack_1170 = uStack_1c70;
      uStack_1168 = uStack_1c68;
      *local_1148 = local_1c80;
      local_1aa0[0x11] = uStack_1c78;
      local_1aa0[0x12] = uStack_1c70;
      local_1aa0[0x13] = uStack_1c68;
      local_1188 = local_1aa0 + 0x14;
      local_11c0 = local_1ca0;
      uStack_11b8 = uStack_1c98;
      uStack_11b0 = uStack_1c90;
      uStack_11a8 = uStack_1c88;
      *local_1188 = local_1ca0;
      local_1aa0[0x15] = uStack_1c98;
      local_1aa0[0x16] = uStack_1c90;
      local_1aa0[0x17] = uStack_1c88;
      local_11c8 = local_1aa0 + 0x18;
      local_1200 = local_1cc0;
      uStack_11f8 = uStack_1cb8;
      uStack_11f0 = uStack_1cb0;
      uStack_11e8 = uStack_1ca8;
      *local_11c8 = local_1cc0;
      local_1aa0[0x19] = uStack_1cb8;
      local_1aa0[0x1a] = uStack_1cb0;
      local_1aa0[0x1b] = uStack_1ca8;
      local_1208 = local_1aa0 + 0x1c;
      local_1240 = local_1ce0;
      uStack_1238 = uStack_1cd8;
      uStack_1230 = uStack_1cd0;
      uStack_1228 = uStack_1cc8;
      *local_1208 = local_1ce0;
      local_1aa0[0x1d] = uStack_1cd8;
      local_1aa0[0x1e] = uStack_1cd0;
      local_1aa0[0x1f] = uStack_1cc8;
      local_1aa0 = local_1aa0 + 0x20;
      local_1640 = local_16f8;
      local_1620 = local_1708;
      local_1ba0 = local_248;
    }
    for (; local_1b1c < local_178c; local_1b1c = local_1b1c + 1) {
      local_1574 = local_1b1c / 8 + local_1b1c % 8;
      local_1568 = &local_1e70;
      local_1570 = &local_17e8;
      local_e0 = (float *)((long)local_17e8 + local_17a8 * local_1574 * local_17d8);
      local_c8 = &local_1e70;
      local_b8 = (long)local_17bc * (long)local_17b8 * local_17d8;
      local_1488 = &local_1e70;
      local_16e8 = &local_1e70;
      local_1e50 = local_17c8;
      local_bc = 0x10;
      local_cc = local_17bc;
      local_d0 = local_17b8;
      local_d4 = local_17b4;
      local_e8 = local_17d8;
      local_ec = local_17d0;
      local_f8 = local_17c8;
      local_1575 = 1;
      local_1428 = &local_1ec0;
      local_1e4 = *(int *)((long)local_1778 + 0x2c);
      local_1e8 = (int)local_1778[6];
      local_1ec = *(undefined4 *)((long)local_1778 + 0x34);
      local_1f8 = (undefined8 *)(*local_1778 + local_1778[8] * (long)local_1a94 * local_1778[2]);
      local_200 = local_1778[2];
      local_204 = (undefined4)local_1778[3];
      local_210 = local_1778[4];
      local_1e0 = &local_1ec0;
      local_68 = (long)local_1e4 * (long)local_1e8 * local_200;
      local_1e38 = 0;
      local_1e3c = 0;
      local_1e40 = 0;
      local_1e44 = 0;
      local_1e58 = 0;
      local_1e60 = 0;
      local_1e68 = 0;
      local_1e70 = 0;
      local_6c = 0x10;
      local_1434 = local_1a94;
      local_1435 = 1;
      local_1e30 = 0;
      local_1e48 = 0;
      local_1460 = &local_1ec0;
      local_16d8 = &local_1ec0;
      local_1ec0 = 0;
      local_1eb0 = 0;
      local_1ea8 = 0;
      local_1e98 = 0;
      local_1e94 = 0;
      local_1e90 = 0;
      local_1e8c = 0;
      local_1e88 = 0;
      local_1e80 = 0;
      local_1eb8 = 0;
      local_1050 = local_21e0;
      local_1f00 = *local_21e0;
      uStack_1ef8 = local_21e0[1];
      uStack_1ef0 = local_21e0[2];
      uStack_1ee8 = local_21e0[3];
      local_1e78 = local_1f8;
      local_1e28 = local_e0;
      for (local_1f04 = 0; local_1f04 < local_1794 * local_1790 * 4; local_1f04 = local_1f04 + 1) {
        local_1290 = local_1e78;
        local_de0 = *local_1e78;
        uStack_dd8 = local_1e78[1];
        uStack_dd0 = local_1e78[2];
        uStack_dc8 = local_1e78[3];
        local_1008 = local_1e28;
        local_1040 = *local_1e28;
        local_dc0 = CONCAT44(local_1040,local_1040);
        uStack_db8 = CONCAT44(local_1040,local_1040);
        uStack_db0 = CONCAT44(local_1040,local_1040);
        uStack_da8 = CONCAT44(local_1040,local_1040);
        local_e00 = local_1f00;
        uStack_df8 = uStack_1ef8;
        uStack_df0 = uStack_1ef0;
        uStack_de8 = uStack_1ee8;
        local_660._0_4_ = (float)local_de0;
        local_660._4_4_ = (float)((ulong)local_de0 >> 0x20);
        uStack_658._0_4_ = (float)uStack_dd8;
        uStack_658._4_4_ = (float)((ulong)uStack_dd8 >> 0x20);
        uStack_650._0_4_ = (float)uStack_dd0;
        uStack_650._4_4_ = (float)((ulong)uStack_dd0 >> 0x20);
        uStack_648._0_4_ = (float)uStack_dc8;
        local_880 = local_1040 * (float)local_660;
        fStack_87c = local_1040 * local_660._4_4_;
        fStack_878 = local_1040 * (float)uStack_658;
        fStack_874 = local_1040 * uStack_658._4_4_;
        fStack_870 = local_1040 * (float)uStack_650;
        fStack_86c = local_1040 * uStack_650._4_4_;
        fStack_868 = local_1040 * (float)uStack_648;
        uVar6 = local_1f00;
        uVar7 = uStack_1ef8;
        uVar8 = uStack_1ef0;
        uVar9 = uStack_1ee8;
        local_8a0._0_4_ = (float)local_1f00;
        local_8a0._4_4_ = (float)((ulong)local_1f00 >> 0x20);
        uStack_898._0_4_ = (float)uStack_1ef8;
        uStack_898._4_4_ = (float)((ulong)uStack_1ef8 >> 0x20);
        uStack_890._0_4_ = (float)uStack_1ef0;
        uStack_890._4_4_ = (float)((ulong)uStack_1ef0 >> 0x20);
        uStack_888._0_4_ = (float)uStack_1ee8;
        uStack_888._4_4_ = (float)((ulong)uStack_1ee8 >> 0x20);
        local_1f00 = CONCAT44(fStack_87c + local_8a0._4_4_,local_880 + (float)local_8a0);
        uStack_1ef8 = CONCAT44(fStack_874 + uStack_898._4_4_,fStack_878 + (float)uStack_898);
        uStack_1ef0 = CONCAT44(fStack_86c + uStack_890._4_4_,fStack_870 + (float)uStack_890);
        uStack_1ee8 = CONCAT44(local_1040 + uStack_888._4_4_,fStack_868 + (float)uStack_888);
        local_1e78 = local_1e78 + 4;
        local_1e28 = local_1e28 + 1;
        fStack_103c = local_1040;
        fStack_1038 = local_1040;
        fStack_1034 = local_1040;
        fStack_1030 = local_1040;
        fStack_102c = local_1040;
        fStack_1028 = local_1040;
        fStack_1024 = local_1040;
        local_100c = local_1040;
        local_8a0 = uVar6;
        uStack_898 = uVar7;
        uStack_890 = uVar8;
        uStack_888 = uVar9;
        fStack_864 = local_1040;
        local_660 = local_de0;
        uStack_658 = uStack_dd8;
        uStack_650 = uStack_dd0;
        uStack_648 = uStack_dc8;
        local_640 = local_1040;
        fStack_63c = local_1040;
        fStack_638 = local_1040;
        fStack_634 = local_1040;
        fStack_630 = local_1040;
        fStack_62c = local_1040;
        fStack_628 = local_1040;
        fStack_624 = local_1040;
      }
      local_1248 = local_1aa0;
      local_1280 = local_1f00;
      uStack_1278 = uStack_1ef8;
      uStack_1270 = uStack_1ef0;
      uStack_1268 = uStack_1ee8;
      *local_1aa0 = local_1f00;
      local_1aa0[1] = uStack_1ef8;
      local_1aa0[2] = uStack_1ef0;
      local_1aa0[3] = uStack_1ee8;
      local_1aa0 = local_1aa0 + 4;
      local_1680 = local_16d8;
      local_1660 = local_16e8;
      local_1ea0 = local_210;
    }
  }
  local_16c8 = &local_17e8;
  if (local_17e0 != (int *)0x0) {
    local_16a4 = 0xffffffff;
    LOCK();
    local_16a8 = *local_17e0;
    *local_17e0 = *local_17e0 + -1;
    UNLOCK();
    if (local_16a8 == 1) {
      local_16a0 = local_16c8;
      if (local_17c8 == (long *)0x0) {
        local_12a0 = local_17e8;
        if (local_17e8 != (void *)0x0) {
          free(local_17e8);
        }
      }
      else {
        (**(code **)(*local_17c8 + 0x18))(local_17c8,local_17e8);
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                kptr += 8;
                tmpptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);

            outptr0 += 8 * 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                kptr += 8;
                tmpptr += 1;
            }

            _mm256_store_ps(outptr0, _sum0);
            outptr0 += 8;
        }
    }
}